

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# php_generator.cc
# Opt level: O1

string * google::protobuf::compiler::php::anon_unknown_2::
         RootPhpNamespace<google::protobuf::Descriptor>
                   (string *__return_storage_ptr__,Descriptor *desc,Options *options)

{
  long lVar1;
  string *full_name;
  long lVar2;
  long *plVar3;
  
  lVar1 = *(long *)(*(long *)(desc + 0x10) + 0x78);
  if ((*(byte *)(lVar1 + 0x28) & 0x80) == 0) {
    full_name = *(string **)(*(long *)(desc + 0x10) + 8);
    if (full_name->_M_string_length != 0) {
      PhpName(__return_storage_ptr__,full_name,options);
      return __return_storage_ptr__;
    }
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  }
  else {
    plVar3 = (long *)(*(ulong *)(lVar1 + 0x80) & 0xfffffffffffffffe);
    lVar1 = plVar3[1];
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    if (lVar1 != 0) {
      lVar2 = *plVar3;
      std::__cxx11::string::_M_construct<char*>
                ((string *)__return_storage_ptr__,lVar2,lVar1 + lVar2);
      return __return_storage_ptr__;
    }
  }
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
  return __return_storage_ptr__;
}

Assistant:

std::string RootPhpNamespace(const DescriptorType* desc,
                             const Options& options) {
  if (desc->file()->options().has_php_namespace()) {
    const std::string& php_namespace = desc->file()->options().php_namespace();
    if (!php_namespace.empty()) {
      return php_namespace;
    }
    return "";
  }

  if (!desc->file()->package().empty()) {
    return PhpName(desc->file()->package(), options);
  }
  return "";
}